

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O1

void __thiscall
MainWindow::configureActions(MainWindow *this,QWidget *widget,ShortcutTable *shortcuts)

{
  QKeySequence *pQVar1;
  char cVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  QWidget *widget_00;
  QMetaType QVar6;
  anon_union_24_3_e3d07ef4_for_data *paVar7;
  QVariant _data;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  anon_union_24_3_e3d07ef4_for_data local_70;
  byte local_58;
  undefined7 uStack_57;
  QKeySequence local_50 [8];
  QList<QAction_*> local_48;
  
  QWidget::actions();
  iVar4 = QList<QAction_*>::begin(&local_48);
  iVar5 = QList<QAction_*>::end(&local_48);
  for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
    paVar7 = &local_70;
    pQVar1 = (QKeySequence *)*iVar4.i;
    cVar2 = QAction::isSeparator();
    if (cVar2 == '\0') {
      QAction::menuObject();
      widget_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (widget_00 == (QWidget *)0x0) {
        QAction::data();
        cVar2 = QMetaType::canConvert
                          ((QMetaTypeInterface *)(CONCAT71(uStack_57,local_58) & 0xfffffffffffffffc)
                           ,(QMetaType)0x206248);
        if (cVar2 != '\0') {
          QVar6.d_ptr._4_4_ = in_stack_ffffffffffffff8c;
          QVar6.d_ptr._0_4_ = in_stack_ffffffffffffff88;
          bVar3 = operator==(QVar6,(QMetaType)0x162106);
          if (!bVar3) {
            in_stack_ffffffffffffff8c = 0;
            QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
            if ((local_58 & 1) != 0) {
              paVar7 = (anon_union_24_3_e3d07ef4_for_data *)
                       (local_70.shared + *(int *)(local_70.shared + 4));
            }
            QMetaType::convert(QVar6,paVar7,(QMetaType)0x206248,&stack0xffffffffffffff8c);
          }
          ShortcutTable::get((ShortcutTable *)local_50,(Shortcut)shortcuts);
          QAction::setShortcut(pQVar1);
          QKeySequence::~QKeySequence(local_50);
        }
        QVariant::~QVariant((QVariant *)&local_70);
      }
      else {
        configureActions(this,widget_00,shortcuts);
      }
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,8);
    }
  }
  return;
}

Assistant:

void MainWindow::configureActions(QWidget &widget, ShortcutTable const& shortcuts) {
    for (auto act : widget.actions()) {
        if (act->isSeparator()) {
            continue;
        } else if (auto menu = act->menu(); menu) {
            // recurse into this menu
            configureActions(*menu, shortcuts);
        } else {
            // check if this action has a shortcut
            auto const _data = act->data();
            if (_data.canConvert<ShortcutTable::Shortcut>()) {
                // yes, set the action's shortcut from the configuration
                act->setShortcut(shortcuts.get(_data.value<ShortcutTable::Shortcut>()));
            }
        }
    }
}